

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O2

Fantasy_Character_union_ref_t
Fantasy_Character_clone(flatbuffers_builder_t *B,Fantasy_Character_union_t u)

{
  ushort uVar1;
  int iVar2;
  Fantasy_Attacker_ref_t ref;
  uint uVar3;
  flatcc_builder_ref_t ref_00;
  void *pvVar4;
  Fantasy_Rapunzel_t *pFVar5;
  Fantasy_BookReader_struct_t p;
  ulong uVar6;
  Fantasy_Character_union_ref_t FVar7;
  
  p = (Fantasy_BookReader_struct_t)u.value;
  uVar3 = u._0_4_ & 0xff;
  FVar7.type = '\0';
  FVar7._1_3_ = 0;
  FVar7.value = 0;
  switch(uVar3) {
  case 2:
    uVar3 = flatcc_builder_refmap_find(B,p);
    uVar6 = (ulong)uVar3;
    if (uVar3 == 0) {
      iVar2 = Fantasy_Attacker_start(B);
      uVar6 = 0;
      if (iVar2 == 0) {
        if (p == (Fantasy_BookReader_struct_t)0x0) {
          __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_reader.h"
                        ,0x487,
                        "const int32_t *Fantasy_Attacker_sword_attack_damage_get_ptr(Fantasy_Attacker_table_t)"
                       );
        }
        if ((5 < *(ushort *)((long)p - (long)p->books_read)) &&
           (uVar1 = *(ushort *)((long)p + (4 - (long)p->books_read)), uVar1 != 0)) {
          uVar6 = 0;
          pvVar4 = flatcc_builder_table_add_copy
                             (B,0,(void *)((long)&p->books_read + (ulong)uVar1),4,4);
          if (pvVar4 == (void *)0x0) goto LAB_0010d71a;
        }
        ref = Fantasy_Attacker_end(B);
        uVar3 = flatcc_builder_refmap_insert(B,p,ref);
        uVar6 = (ulong)uVar3;
      }
    }
LAB_0010d71a:
    FVar7 = (Fantasy_Character_union_ref_t)(uVar6 << 0x20 | 2);
    break;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    break;
  case 8:
    uVar3 = flatcc_builder_refmap_find(B,p);
    uVar6 = (ulong)uVar3;
    if (uVar3 == 0) {
      pFVar5 = Fantasy_Rapunzel_start(B);
      if (pFVar5 == (Fantasy_Rapunzel_t *)0x0) {
        uVar6 = 0;
      }
      else {
        pFVar5->hair_length = (uint16_t)p->books_read;
        pFVar5->__deprecated0[0] = '\0';
        ref_00 = flatcc_builder_end_struct(B);
        uVar3 = flatcc_builder_refmap_insert(B,p,ref_00);
        uVar6 = (ulong)uVar3;
      }
    }
    FVar7 = (Fantasy_Character_union_ref_t)(uVar6 << 0x20 | 8);
    break;
  case 9:
    uVar3 = Fantasy_BookReader_clone(B,p);
    FVar7 = (Fantasy_Character_union_ref_t)((ulong)uVar3 << 0x20 | 9);
    break;
  case 10:
    uVar3 = Fantasy_BookReader_clone(B,p);
    FVar7 = (Fantasy_Character_union_ref_t)((ulong)uVar3 << 0x20 | 10);
    break;
  case 0xb:
    uVar3 = flatbuffers_string_clone(B,(flatbuffers_string_t)p);
    FVar7 = (Fantasy_Character_union_ref_t)((ulong)uVar3 << 0x20 | 0xb);
    break;
  default:
    if (uVar3 == 0xff) {
      uVar3 = flatbuffers_string_clone(B,(flatbuffers_string_t)p);
      FVar7 = (Fantasy_Character_union_ref_t)((ulong)uVar3 << 0x20 | 0xff);
    }
  }
  return FVar7;
}

Assistant:

static Fantasy_Character_union_ref_t Fantasy_Character_clone(flatbuffers_builder_t *B, Fantasy_Character_union_t u)
{
    switch (u.type) {
    case 2: return Fantasy_Character_as_MuLan(Fantasy_Attacker_clone(B, (Fantasy_Attacker_table_t)u.value));
    case 8: return Fantasy_Character_as_Rapunzel(Fantasy_Rapunzel_clone(B, (Fantasy_Rapunzel_struct_t)u.value));
    case 9: return Fantasy_Character_as_Belle(Fantasy_BookReader_clone(B, (Fantasy_BookReader_struct_t)u.value));
    case 10: return Fantasy_Character_as_BookFan(Fantasy_BookReader_clone(B, (Fantasy_BookReader_struct_t)u.value));
    case 11: return Fantasy_Character_as_Other(flatbuffers_string_clone(B, u.value));
    case 255: return Fantasy_Character_as_Unused(flatbuffers_string_clone(B, u.value));
    default: return Fantasy_Character_as_NONE();
    }
}